

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

ssize_t __thiscall
Json::StyledStreamWriter::write(StyledStreamWriter *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  ostream *poVar2;
  undefined4 in_register_00000034;
  
  this->document_ = (OStream *)CONCAT44(in_register_00000034,__fd);
  this->field_0x68 = this->field_0x68 & 0xfe;
  (this->indentString_)._M_string_length = 0;
  *(this->indentString_)._M_dataplus._M_p = '\0';
  this->field_0x68 = this->field_0x68 | 2;
  writeCommentBeforeValue(this,(Value *)__buf);
  bVar1 = this->field_0x68;
  if ((bVar1 & 2) == 0) {
    writeIndent(this);
    bVar1 = this->field_0x68;
  }
  this->field_0x68 = bVar1 | 2;
  writeValue(this,(Value *)__buf);
  writeCommentAfterValueOnSameLine(this,(Value *)__buf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(this->document_,"\n",1);
  this->document_ = (OStream *)0x0;
  return (ssize_t)poVar2;
}

Assistant:

void StyledStreamWriter::write(OStream& out, const Value& root) {
  document_ = &out;
  addChildValues_ = false;
  indentString_.clear();
  indented_ = true;
  writeCommentBeforeValue(root);
  if (!indented_)
    writeIndent();
  indented_ = true;
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  *document_ << "\n";
  document_ = nullptr; // Forget the stream, for safety.
}